

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserMhapTest_ParseInChunks_Test::~BioparserMhapTest_ParseInChunks_Test
          (BioparserMhapTest_ParseInChunks_Test *this)

{
  BioparserMhapTest::~BioparserMhapTest(&this->super_BioparserMhapTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, ParseInChunks) {
  Setup("sample.mhap");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}